

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O2

bool __thiscall TextBuffer::Layer::is_modified(Layer *this,Layer *base_layer)

{
  bool result;
  uint32_t start_offset;
  bool local_51;
  Layer *local_50;
  uint32_t local_44;
  Point local_40;
  anon_class_24_3_34d1d317 local_38;
  
  local_51 = true;
  if (this->size_ == base_layer->size_) {
    local_51 = false;
    local_44 = 0;
    local_50 = base_layer;
    Point::Point(&local_40);
    local_38.base_layer = &local_50;
    local_38.start_offset = &local_44;
    local_38.result = &local_51;
    for_each_chunk_in_range<TextBuffer::Layer::is_modified(TextBuffer::Layer_const*)::_lambda(TextSlice)_1_>
              (this,local_40,this->extent_,&local_38,false);
  }
  return local_51;
}

Assistant:

bool is_modified(const Layer *base_layer) {
    if (size() != base_layer->size()) return true;

    bool result = false;
    uint32_t start_offset = 0;
    for_each_chunk_in_range(Point(), extent(), [&](TextSlice chunk) {
      if (chunk.text == &(*base_layer->text) ||
          equal(chunk.begin(), chunk.end(), base_layer->text->begin() + start_offset)) {
        start_offset += chunk.size();
        return false;
      }
      result = true;
      return true;
    });

    return result;
  }